

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyErrorSummary(TidyDocImpl *doc)

{
  int iVar1;
  ctmbstr ptVar2;
  char *pcStack_18;
  int charenc;
  ctmbstr encnam;
  TidyDocImpl *doc_local;
  
  pcStack_18 = tidyLocalizedString(0x812);
  iVar1 = (int)(doc->config).value[4].v;
  if (iVar1 == 7) {
    pcStack_18 = "Windows-1252";
  }
  else if (iVar1 == 6) {
    pcStack_18 = "MacRoman";
  }
  else if (iVar1 == 8) {
    pcStack_18 = "ibm858";
  }
  else if (iVar1 == 2) {
    pcStack_18 = "latin0";
  }
  if (((doc->badAccess & 0x30) != 0) &&
     (((doc->badAccess & 0x10) == 0 || ((doc->badAccess & 0x20) != 0)))) {
    doc->badAccess = doc->badAccess & 0xffffffcf;
  }
  if (doc->badChars != 0) {
    if ((doc->badChars & 1) != 0) {
      ptVar2 = tidyLocalizedString(0x82d);
      tidy_out(doc,ptVar2,pcStack_18);
    }
    if (((doc->badChars & 2) != 0) || ((doc->badChars & 0x40) != 0)) {
      ptVar2 = tidyLocalizedString(0x826);
      tidy_out(doc,ptVar2,pcStack_18);
    }
    if ((doc->badChars & 4) != 0) {
      ptVar2 = tidyLocalizedString(0x820);
      tidy_out(doc,"%s",ptVar2);
    }
    if ((doc->badChars & 8) != 0) {
      ptVar2 = tidyLocalizedString(0x81f);
      tidy_out(doc,"%s",ptVar2);
    }
    if ((doc->badChars & 0x20) != 0) {
      ptVar2 = tidyLocalizedString(0x81e);
      tidy_out(doc,"%s",ptVar2);
    }
  }
  if ((doc->badForm & 1) != 0) {
    ptVar2 = tidyLocalizedString(0x819);
    tidy_out(doc,"%s",ptVar2);
  }
  if ((doc->badForm & 2) != 0) {
    ptVar2 = tidyLocalizedString(0x81a);
    tidy_out(doc,"%s",ptVar2);
  }
  if (doc->badAccess != 0) {
    if ((doc->config).value[0x54].v == 0) {
      if ((doc->badAccess & 4) != 0) {
        ptVar2 = tidyLocalizedString(0x824);
        tidy_out(doc,"%s",ptVar2);
      }
      if ((doc->badAccess & 1) != 0) {
        ptVar2 = tidyLocalizedString(0x821);
        tidy_out(doc,"%s",ptVar2);
      }
      if ((doc->badAccess & 8) != 0) {
        ptVar2 = tidyLocalizedString(0x822);
        tidy_out(doc,"%s",ptVar2);
      }
      if ((doc->badAccess & 2) != 0) {
        ptVar2 = tidyLocalizedString(0x823);
        tidy_out(doc,"%s",ptVar2);
      }
      if (((doc->badAccess & 0x10) != 0) && ((doc->badAccess & 0x20) == 0)) {
        ptVar2 = tidyLocalizedString(0x829);
        tidy_out(doc,"%s",ptVar2);
      }
    }
    ptVar2 = tidyLocalizedString(0x817);
    tidy_out(doc,"%s",ptVar2);
    if ((doc->config).value[0x54].v != 0) {
      ptVar2 = tidyLocalizedString(0x818);
      tidy_out(doc,"%s",ptVar2);
    }
    tidy_out(doc,".\n");
  }
  if (doc->badLayout != 0) {
    if ((doc->badLayout & 2) != 0) {
      ptVar2 = tidyLocalizedString(0x82a);
      tidy_out(doc,"%s",ptVar2);
    }
    if ((doc->badLayout & 1) != 0) {
      ptVar2 = tidyLocalizedString(0x82c);
      tidy_out(doc,"%s",ptVar2);
    }
    if ((doc->badLayout & 8) != 0) {
      ptVar2 = tidyLocalizedString(0x828);
      tidy_out(doc,"%s",ptVar2);
    }
    if ((doc->badLayout & 4) != 0) {
      ptVar2 = tidyLocalizedString(0x82b);
      tidy_out(doc,"%s",ptVar2);
    }
    if ((doc->badLayout & 0x10) != 0) {
      ptVar2 = tidyLocalizedString(0x827);
      tidy_out(doc,"%s",ptVar2);
    }
  }
  return;
}

Assistant:

void TY_(ErrorSummary)( TidyDocImpl* doc )
{
    ctmbstr encnam = tidyLocalizedString(STRING_SPECIFIED);
    int charenc = cfg( doc, TidyCharEncoding ); 
    if ( charenc == WIN1252 ) 
        encnam = "Windows-1252";
    else if ( charenc == MACROMAN )
        encnam = "MacRoman";
    else if ( charenc == IBM858 )
        encnam = "ibm858";
    else if ( charenc == LATIN0 )
        encnam = "latin0";

    /* adjust badAccess to that it is 0 if frames are ok */
    if ( doc->badAccess & (BA_USING_FRAMES | BA_USING_NOFRAMES) )
    {
        if (!((doc->badAccess & BA_USING_FRAMES) && !(doc->badAccess & BA_USING_NOFRAMES)))
            doc->badAccess &= ~(BA_USING_FRAMES | BA_USING_NOFRAMES);
    }

    if (doc->badChars)
    {
#if 0
        if ( doc->badChars & WINDOWS_CHARS )
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_WINDOWS_CHARS));
        }
#endif
        if (doc->badChars & BC_VENDOR_SPECIFIC_CHARS)
        {
            tidy_out(doc, tidyLocalizedString(TEXT_VENDOR_CHARS), encnam);
        }
        if ((doc->badChars & BC_INVALID_SGML_CHARS) || (doc->badChars & BC_INVALID_NCR))
        {
            tidy_out(doc, tidyLocalizedString(TEXT_SGML_CHARS), encnam);
        }
        if (doc->badChars & BC_INVALID_UTF8)
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_INVALID_UTF8));
        }

#if SUPPORT_UTF16_ENCODINGS

      if (doc->badChars & BC_INVALID_UTF16)
      {
          tidy_out(doc, "%s", tidyLocalizedString(TEXT_INVALID_UTF16));
      }

#endif

      if (doc->badChars & BC_INVALID_URI)
      {
          tidy_out(doc, "%s", tidyLocalizedString(TEXT_INVALID_URI));
      }
    }

    if (doc->badForm & flg_BadForm) /* Issue #166 - changed to BIT flag to support other errors */
    {
        tidy_out(doc, "%s", tidyLocalizedString(TEXT_BAD_FORM));
    }

    if (doc->badForm & flg_BadMain) /* Issue #166 - repeated <main> element */
    {
        tidy_out(doc, "%s", tidyLocalizedString(TEXT_BAD_MAIN));
    }
    
    if (doc->badAccess)
    {
        /* Tidy "classic" accessibility tests */
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            if (doc->badAccess & BA_MISSING_SUMMARY)
            {
                tidy_out(doc, "%s", tidyLocalizedString(TEXT_M_SUMMARY));
            }

            if (doc->badAccess & BA_MISSING_IMAGE_ALT)
            {
                tidy_out(doc, "%s", tidyLocalizedString(TEXT_M_IMAGE_ALT));
            }

            if (doc->badAccess & BA_MISSING_IMAGE_MAP)
            {
                tidy_out(doc, "%s", tidyLocalizedString(TEXT_M_IMAGE_MAP));
            }

            if (doc->badAccess & BA_MISSING_LINK_ALT)
            {
                tidy_out(doc, "%s", tidyLocalizedString(TEXT_M_LINK_ALT));
            }

            if ((doc->badAccess & BA_USING_FRAMES) && !(doc->badAccess & BA_USING_NOFRAMES))
            {
                tidy_out(doc, "%s", tidyLocalizedString(TEXT_USING_FRAMES));
            }
        }

        tidy_out(doc, "%s", tidyLocalizedString(TEXT_ACCESS_ADVICE1));
        if ( cfg(doc, TidyAccessibilityCheckLevel) > 0 )
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_ACCESS_ADVICE2));
        tidy_out(doc, ".\n" );
    }

    if (doc->badLayout)
    {
        if (doc->badLayout & USING_LAYER)
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_USING_LAYER));
        }

        if (doc->badLayout & USING_SPACER)
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_USING_SPACER));
        }

        if (doc->badLayout & USING_FONT)
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_USING_FONT));
        }

        if (doc->badLayout & USING_NOBR)
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_USING_NOBR));
        }

        if (doc->badLayout & USING_BODY)
        {
            tidy_out(doc, "%s", tidyLocalizedString(TEXT_USING_BODY));
        }
    }
}